

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_serial_gets(char *buf,size_t size,mbedtls_x509_buf *serial)

{
  int iVar1;
  char *pcVar2;
  ulong local_58;
  char *local_50;
  char *p;
  size_t nr;
  size_t n;
  size_t i;
  int ret;
  mbedtls_x509_buf *serial_local;
  size_t size_local;
  char *buf_local;
  
  if (serial->len < 0x21) {
    local_58 = serial->len;
  }
  else {
    local_58 = 0x1c;
  }
  n = 0;
  local_50 = buf;
  nr = size;
  do {
    if (local_58 <= n) {
      if (local_58 != serial->len) {
        iVar1 = snprintf(local_50,nr,"....");
        if ((iVar1 < 0) || (nr <= (ulong)(long)iVar1)) {
          return -0x2980;
        }
        nr = nr - (long)iVar1;
      }
      return (int)size - (int)nr;
    }
    if (((n != 0) || (local_58 < 2)) || (*serial->p != '\0')) {
      pcVar2 = anon_var_dwarf_6e6e + 9;
      if (n < local_58 - 1) {
        pcVar2 = ":";
      }
      iVar1 = snprintf(local_50,nr,"%02X%s",(ulong)serial->p[n],pcVar2);
      if ((iVar1 < 0) || (nr <= (ulong)(long)iVar1)) {
        return -0x2980;
      }
      nr = nr - (long)iVar1;
      local_50 = local_50 + iVar1;
    }
    n = n + 1;
  } while( true );
}

Assistant:

int mbedtls_x509_serial_gets( char *buf, size_t size, const mbedtls_x509_buf *serial )
{
    int ret;
    size_t i, n, nr;
    char *p;

    p = buf;
    n = size;

    nr = ( serial->len <= 32 )
        ? serial->len  : 28;

    for( i = 0; i < nr; i++ )
    {
        if( i == 0 && nr > 1 && serial->p[i] == 0x0 )
            continue;

        ret = mbedtls_snprintf( p, n, "%02X%s",
                serial->p[i], ( i < nr - 1 ) ? ":" : "" );
        MBEDTLS_X509_SAFE_SNPRINTF;
    }

    if( nr != serial->len )
    {
        ret = mbedtls_snprintf( p, n, "...." );
        MBEDTLS_X509_SAFE_SNPRINTF;
    }

    return( (int) ( size - n ) );
}